

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeRAW.cpp
# Opt level: O1

uint __thiscall FormatTypeRAW::ComputeTrack(FormatTypeRAW *this,int index,Revolution *revolution)

{
  uint uVar1;
  pointer paVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uchar uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  uint *puVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  
  lVar12 = (long)index;
  paVar2 = (this->index_list_).
           super__Vector_base<FormatTypeRAW::IndexElement,_std::allocator<FormatTypeRAW::IndexElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar11 = this->nb_flux_value_;
  if (uVar11 == 0) {
    uVar16 = 0;
  }
  else {
    uVar16 = 0;
    do {
      if (paVar2[lVar12].stream_position <= this->flux_list_[uVar16].stream_position)
      goto LAB_0015fa0f;
      uVar16 = uVar16 + 1;
    } while (uVar11 != (uint)uVar16);
    uVar16 = (ulong)uVar11;
  }
LAB_0015fa0f:
  uVar15 = (uint)uVar16;
  uVar7 = uVar15;
  if (uVar15 < uVar11) {
    puVar14 = &this->flux_list_[uVar16 & 0xffffffff].stream_position;
    uVar16 = uVar16 & 0xffffffff;
    do {
      uVar7 = (uint)uVar16;
      if (*puVar14 == paVar2[lVar12 + 1].stream_position) break;
      uVar17 = (uint)uVar16 + 1;
      uVar16 = (ulong)uVar17;
      puVar14 = puVar14 + 2;
      uVar7 = uVar11;
    } while (uVar11 != uVar17);
  }
  uVar17 = 0;
  uVar11 = 0;
  iVar9 = 0;
  if (uVar15 != 0) {
    uVar11 = this->flux_list_[uVar15 - 1].flux_value;
    iVar9 = uVar11 - paVar2[lVar12].flux_value;
    if (uVar11 < paVar2[lVar12].flux_value || iVar9 == 0) {
      uVar11 = 0;
    }
    else {
      uVar11 = (uint)(iVar9 * 0xa293) / 1000;
      iVar9 = 0;
    }
  }
  uVar6 = 2000;
  if (uVar15 < uVar7) {
    uVar1 = paVar2[lVar12 + 1].flux_value;
    iVar13 = 0;
    uVar17 = 0;
    iVar19 = 0;
    uVar10 = uVar15;
    do {
      if ((int)uVar11 < (int)(uVar6 >> 1)) {
        uVar18 = this->flux_list_[uVar10].flux_value;
        if (uVar10 == uVar15) {
          uVar18 = uVar18 + iVar9;
        }
        else if (uVar10 + 1 == uVar7) {
          iVar13 = (int)(((double)uVar1 * 41619.0) / 1000.0 - (double)(int)uVar6);
        }
        uVar11 = (uVar18 * 0xa293) / 1000 + uVar11;
        iVar19 = 0;
        uVar10 = uVar10 + 1;
      }
      uVar11 = uVar11 - uVar6;
      if ((int)uVar11 < (int)(uVar6 >> 1)) {
        if (revolution != (Revolution *)0x0) {
          revolution[lVar12].bitfield[uVar17] = '\x01';
        }
        if (iVar19 - 1U < 3) {
          iVar4 = (int)uVar11 / (iVar19 + 1);
          iVar5 = iVar4 / 5 + (iVar4 >> 0x1f);
        }
        else {
          iVar4 = 2000 - uVar6;
          iVar5 = iVar4 / 0x14 + (iVar4 >> 0x1f);
        }
        uVar6 = (iVar5 - (iVar4 >> 0x1f)) + uVar6;
        if (0x897 < (int)uVar6) {
          uVar6 = 0x898;
        }
        if ((int)uVar6 < 0x709) {
          uVar6 = 0x708;
        }
        uVar11 = (int)uVar11 / 2;
      }
      else {
        if (revolution != (Revolution *)0x0) {
          revolution[lVar12].bitfield[uVar17] = '\0';
        }
        iVar19 = iVar19 + 1;
      }
      uVar17 = uVar17 + 1;
    } while (uVar10 < uVar7);
  }
  else {
    iVar13 = 0;
  }
  uVar7 = uVar6 >> 1;
  if (((int)uVar7 <= (int)uVar11) && (0 < iVar13)) {
    iVar19 = uVar11 - uVar6;
    iVar9 = iVar13 - uVar6;
    do {
      if (iVar19 < (int)uVar7) {
        uVar8 = '\x01';
        if (revolution != (Revolution *)0x0) {
LAB_0015fbf7:
          revolution[lVar12].bitfield[uVar17] = uVar8;
        }
      }
      else if (revolution != (Revolution *)0x0) {
        uVar8 = '\0';
        goto LAB_0015fbf7;
      }
      uVar17 = uVar17 + 1;
      if (iVar19 < (int)uVar7) {
        return uVar17;
      }
      iVar19 = iVar19 - uVar6;
      bVar3 = 0 < iVar9;
      iVar9 = iVar9 - uVar6;
    } while (bVar3);
  }
  return uVar17;
}

Assistant:

unsigned int FormatTypeRAW::ComputeTrack(int index, IDisk::Revolution* revolution)
{
#define CLOCK_MAX_ADJ 10
#define CLOCK_MIN(_c) (((_c) * (100 - CLOCK_MAX_ADJ)) / 100)
#define CLOCK_MAX(_c) (((_c) * (100 + CLOCK_MAX_ADJ)) / 100)

#define MCK_FREQ (((18432000 * 73) / 14) / 2)
#define SCK_FREQ (MCK_FREQ / 2)
#define ICK_FREQ (MCK_FREQ / 16)
#define SCK_PS_PER_TICK (1000000000/(SCK_FREQ/1000))
#define PERIOD_ADJ_PCT 5

   int flux = 0;
   int clock = 2000; // 2 us
   int clock_centre = clock;
   unsigned int i = 0;
   unsigned int nb_bit_in_flux = 0;
   int clocked_zeros = 0;

   IndexElement debut = index_list_[index];
   IndexElement fin = index_list_[index + 1];

   unsigned int j;
   double first_flux_value = 0, last_flux_value = 0;
   // Get next cell
   for (i = 0; i < nb_flux_value_; i++)
   {
      if (flux_list_[i].stream_position >= debut.stream_position)
      {
         break;
      }
   }
   for (j = i; j < nb_flux_value_; j++)
   {
      if (flux_list_[j].stream_position == fin.stream_position)
      {
         //last_flux_value = fin.flux_value; // m_FluxList[j].flux_value;
         //j --;
         break;
      }
   }
   nb_bit_in_flux = 0;

   // Get the proper first cell
   first_flux_value = debut.flux_value;
   last_flux_value = fin.flux_value;

   int remaining = 0;
   int remaining_negative = 0;
   // Value of the first cell :
   if (i > 0)
   {
      if (flux_list_[i - 1].flux_value > first_flux_value)
         remaining = flux_list_[i - 1].flux_value - static_cast<int>(first_flux_value);
      else
         remaining_negative = static_cast<int>(first_flux_value) - flux_list_[i - 1].flux_value;
   }

   // Adjust first / last, to avoid having a double bit


   // Cell first ??
   flux = (remaining * SCK_PS_PER_TICK) / 1000u;
   int end_flux = 0;
   //flux = remaining;

   unsigned int k = i;
   //i = 0;
   //while (i < sizeOfBuffer*2)
   for (; k < j;)
   {
      // What's the current flux status
      // Under a half clock : add the next one
      if (flux < clock / 2 && k < j)
      {
         int localflux = flux_list_[k++].flux_value;
         if (k - 1 == i)
         {
            localflux -= remaining_negative;
         }
         else if (k == j)
         {
            end_flux = static_cast<int>((last_flux_value * SCK_PS_PER_TICK) / 1000u - clock);
            // Compute last flux : It's xomputed to know WHEN to stop, not WHAT is it containing.

            /*
            if (last_flux_value < localflux)
            localflux = last_flux_value;
            else
            {
            // To check
            int dbg = 1;
            localflux = last_flux_value;
            }*/
         }

         flux += (localflux * SCK_PS_PER_TICK) / 1000u;
         clocked_zeros = 0;
      }

      // Remove a clock value to the flux
      flux -= clock;

      // If it remains at least a half clock : A zero's there
      if (flux >= clock / 2)
      {
         if (revolution != NULL) revolution[index].bitfield[nb_bit_in_flux] = 0;
         clocked_zeros++;
         nb_bit_in_flux++;
      }
      else
      {
         // Otherwise, we have a one
         if (revolution != NULL) revolution[index].bitfield[nb_bit_in_flux] = 1;
         nb_bit_in_flux++;

         // PLL computations HERE !
         if ((clocked_zeros >= 1) && (clocked_zeros <= 3))
         {
            // In sync: adjust base clock by 10% of phase mismatch.
            int diff = flux / (int)(clocked_zeros + 1);
            clock += diff / PERIOD_ADJ_PCT;
         }
         else
         {
            clock += (clock_centre - clock) * PERIOD_ADJ_PCT / 100;
         }


         clock = max(CLOCK_MIN(clock_centre),
                     min(CLOCK_MAX(clock_centre), clock));

         flux = flux / 2;
      }
   }

   // End adjustement
   while (flux >= clock / 2 && end_flux > 0)
   {
      flux -= clock;
      end_flux -= clock;

      // If it remains at least a half clock : A zero's there
      if (flux >= clock / 2)
      {
         if (revolution != NULL) revolution[index].bitfield[nb_bit_in_flux] = 0;
         clocked_zeros++;
         nb_bit_in_flux++;
      }
      else
      {
         // NOT ALWAYS : We have a ending one when the last flux reversal is smaller than the flux index
         // Otherwise, we have a one
         //if (last_flux_value > m_FluxList[j-1].flux_value )
         // This should be rethought and adjusted.... TODO
         //if (flux >= -(clock / 2))
         {
            // To check
            if (revolution != NULL) revolution[index].bitfield[nb_bit_in_flux] = 1;
            nb_bit_in_flux++;
         }
      }
   }

   return nb_bit_in_flux;
}